

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool SignatureHashSchnorr<CTransaction>
               (uint256 *hash_out,ScriptExecutionData *execdata,CTransaction *tx_to,uint32_t in_pos,
               uint8_t hash_type,SigVersion sigversion,PrecomputedTransactionData *cache,
               MissingDataBehavior mdb)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint32_t *puVar9;
  CSHA256 *pCVar10;
  long in_FS_OFFSET;
  uint256 result;
  HashWriter sha_single_output;
  HashWriter ss;
  CAmount local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  CSHA256 local_108;
  CSHA256 local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sigversion == TAPROOT) {
    bVar8 = 0;
  }
  else {
    if (sigversion != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x5d7,
                    "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                   );
    }
    bVar8 = 2;
  }
  uVar7 = (ulong)in_pos;
  uVar5 = ((long)(tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
    __assert_fail("in_pos < tx_to.vin.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x5d9,
                  "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                 );
  }
  if ((cache->m_bip341_taproot_ready == true) && (cache->m_spent_outputs_ready != false)) {
    puVar9 = (uint32_t *)&HASHER_TAPSIGHASH;
    pCVar10 = &local_a0;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pCVar10->s = *(undefined8 *)puVar9;
      puVar9 = puVar9 + 2;
      pCVar10 = (CSHA256 *)(pCVar10->s + 2);
    }
    local_108.s._0_8_ = local_108.s._0_8_ & 0xffffffffffffff00;
    CSHA256::Write(&local_a0,(uchar *)&local_108,1);
    bVar4 = 1;
    if (hash_type != '\0') {
      bVar4 = hash_type & 3;
    }
    if ((3 < hash_type) && (2 < hash_type - 0x81)) goto LAB_0079d8b4;
    local_108.s[0]._0_1_ = hash_type;
    CSHA256::Write(&local_a0,(uchar *)&local_108,1);
    local_108.s[0] = tx_to->version;
    CSHA256::Write(&local_a0,(uchar *)&local_108,4);
    local_108.s[0] = tx_to->nLockTime;
    CSHA256::Write(&local_a0,(uchar *)&local_108,4);
    if (-1 < (char)hash_type) {
      CSHA256::Write(&local_a0,(uchar *)cache,0x20);
      CSHA256::Write(&local_a0,(uchar *)&cache->m_spent_amounts_single_hash,0x20);
      CSHA256::Write(&local_a0,(uchar *)&cache->m_spent_scripts_single_hash,0x20);
      CSHA256::Write(&local_a0,(uchar *)&cache->m_sequences_single_hash,0x20);
    }
    if (bVar4 == 1) {
      CSHA256::Write(&local_a0,(uchar *)&cache->m_outputs_single_hash,0x20);
    }
    if (execdata->m_annex_init == false) {
      __assert_fail("execdata.m_annex_init",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x5f8,
                    "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                   );
    }
    bVar3 = execdata->m_annex_present;
    local_108.s[0]._0_1_ = bVar8 | bVar3;
    CSHA256::Write(&local_a0,(uchar *)&local_108,1);
    if ((char)hash_type < '\0') {
      pCVar2 = (tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      CSHA256::Write(&local_a0,(uchar *)(pCVar2 + uVar7),0x20);
      local_108.s[0] = pCVar2[uVar7].prevout.n;
      CSHA256::Write(&local_a0,(uchar *)&local_108,4);
      pCVar1 = (cache->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start + uVar7;
      local_108.s._0_8_ = pCVar1->nValue;
      CSHA256::Write(&local_a0,(uchar *)&local_108,8);
      SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                ((HashWriter *)&local_a0,&(pCVar1->scriptPubKey).super_CScriptBase);
      local_108.s[0] =
           (tx_to->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7].nSequence;
    }
    else {
      local_108.s[0] = in_pos;
    }
    CSHA256::Write(&local_a0,(uchar *)&local_108,4);
    if (bVar3 != false) {
      CSHA256::Write(&local_a0,(uchar *)&execdata->m_annex_hash,0x20);
    }
    if (bVar4 == 3) {
      uVar5 = ((long)(tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar5 < uVar7 || uVar5 - uVar7 == 0) goto LAB_0079d8b4;
      if ((execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == false) {
        local_108.buf[0x30] = '\0';
        local_108.buf[0x31] = '\0';
        local_108.buf[0x32] = '\0';
        local_108.buf[0x33] = '\0';
        local_108.buf[0x34] = '\0';
        local_108.buf[0x35] = '\0';
        local_108.buf[0x36] = '\0';
        local_108.buf[0x37] = '\0';
        local_108.buf[0x38] = '\0';
        local_108.buf[0x39] = '\0';
        local_108.buf[0x3a] = '\0';
        local_108.buf[0x3b] = '\0';
        local_108.buf[0x3c] = '\0';
        local_108.buf[0x3d] = '\0';
        local_108.buf[0x3e] = '\0';
        local_108.buf[0x3f] = '\0';
        local_108.buf[0x20] = '\0';
        local_108.buf[0x21] = '\0';
        local_108.buf[0x22] = '\0';
        local_108.buf[0x23] = '\0';
        local_108.buf[0x24] = '\0';
        local_108.buf[0x25] = '\0';
        local_108.buf[0x26] = '\0';
        local_108.buf[0x27] = '\0';
        local_108.buf[0x28] = '\0';
        local_108.buf[0x29] = '\0';
        local_108.buf[0x2a] = '\0';
        local_108.buf[0x2b] = '\0';
        local_108.buf[0x2c] = '\0';
        local_108.buf[0x2d] = '\0';
        local_108.buf[0x2e] = '\0';
        local_108.buf[0x2f] = '\0';
        local_108.buf[0x10] = '\0';
        local_108.buf[0x11] = '\0';
        local_108.buf[0x12] = '\0';
        local_108.buf[0x13] = '\0';
        local_108.buf[0x14] = '\0';
        local_108.buf[0x15] = '\0';
        local_108.buf[0x16] = '\0';
        local_108.buf[0x17] = '\0';
        local_108.buf[0x18] = '\0';
        local_108.buf[0x19] = '\0';
        local_108.buf[0x1a] = '\0';
        local_108.buf[0x1b] = '\0';
        local_108.buf[0x1c] = '\0';
        local_108.buf[0x1d] = '\0';
        local_108.buf[0x1e] = '\0';
        local_108.buf[0x1f] = '\0';
        local_108.buf[0] = '\0';
        local_108.buf[1] = '\0';
        local_108.buf[2] = '\0';
        local_108.buf[3] = '\0';
        local_108.buf[4] = '\0';
        local_108.buf[5] = '\0';
        local_108.buf[6] = '\0';
        local_108.buf[7] = '\0';
        local_108.buf[8] = '\0';
        local_108.buf[9] = '\0';
        local_108.buf[10] = '\0';
        local_108.buf[0xb] = '\0';
        local_108.buf[0xc] = '\0';
        local_108.buf[0xd] = '\0';
        local_108.buf[0xe] = '\0';
        local_108.buf[0xf] = '\0';
        local_108.s[4] = 0;
        local_108.s[5] = 0;
        local_108.s[6] = 0;
        local_108.s[7] = 0;
        local_108.s[0] = 0;
        local_108.s[1] = 0;
        local_108.s[2] = 0;
        local_108.s[3] = 0;
        local_108.bytes = 0;
        CSHA256::CSHA256(&local_108);
        pCVar1 = (tx_to->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar7;
        local_128 = pCVar1->nValue;
        CSHA256::Write(&local_108,(uchar *)&local_128,8);
        SerializeMany<HashWriter,prevector<28u,unsigned_char,unsigned_int,int>>
                  ((HashWriter *)&local_108,&(pCVar1->scriptPubKey).super_CScriptBase);
        local_118 = 0;
        uStack_110 = 0;
        local_128 = 0;
        uStack_120 = 0;
        CSHA256::Finalize(&local_108,(uchar *)&local_128);
        bVar3 = (execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_engaged;
        *(undefined8 *)
         ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x10) = local_118;
        *(undefined8 *)
         ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x18) = uStack_110;
        *(CAmount *)
         &(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload = local_128;
        *(undefined8 *)
         ((long)&(execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 8) = uStack_120;
        if (bVar3 == false) {
          (execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged = true;
        }
      }
      if ((execdata->m_output_hash).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
        goto LAB_0079dc14;
      }
      CSHA256::Write(&local_a0,(uchar *)&execdata->m_output_hash,0x20);
    }
    if (sigversion == TAPSCRIPT) {
      if (execdata->m_tapleaf_hash_init == false) {
        __assert_fail("execdata.m_tapleaf_hash_init",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                      ,0x614,
                      "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                     );
      }
      CSHA256::Write(&local_a0,(uchar *)&execdata->m_tapleaf_hash,0x20);
      local_108.s._0_8_ = local_108.s._0_8_ & 0xffffffffffffff00;
      CSHA256::Write(&local_a0,(uchar *)&local_108,1);
      if (execdata->m_codeseparator_pos_init == false) {
        __assert_fail("execdata.m_codeseparator_pos_init",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                      ,0x617,
                      "bool SignatureHashSchnorr(uint256 &, ScriptExecutionData &, const T &, uint32_t, uint8_t, SigVersion, const PrecomputedTransactionData &, MissingDataBehavior) [T = CTransaction]"
                     );
      }
      local_108.s[0] = execdata->m_codeseparator_pos;
      CSHA256::Write(&local_a0,(uchar *)&local_108,4);
    }
    local_108.s[4] = 0;
    local_108.s[5] = 0;
    local_108.s[6] = 0;
    local_108.s[7] = 0;
    local_108.s[0] = 0;
    local_108.s[1] = 0;
    local_108.s[2] = 0;
    local_108.s[3] = 0;
    CSHA256::Finalize(&local_a0,(uchar *)&local_108);
    *(undefined8 *)((hash_out->super_base_blob<256U>).m_data._M_elems + 0x10) = local_108.s._16_8_;
    *(undefined8 *)((hash_out->super_base_blob<256U>).m_data._M_elems + 0x18) = local_108.s._24_8_;
    *(undefined8 *)(hash_out->super_base_blob<256U>).m_data._M_elems = local_108.s._0_8_;
    *(undefined8 *)((hash_out->super_base_blob<256U>).m_data._M_elems + 8) = local_108.s._8_8_;
    bVar3 = true;
  }
  else {
    HandleMissingData(mdb);
LAB_0079d8b4:
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
LAB_0079dc14:
  __stack_chk_fail();
}

Assistant:

bool SignatureHashSchnorr(uint256& hash_out, ScriptExecutionData& execdata, const T& tx_to, uint32_t in_pos, uint8_t hash_type, SigVersion sigversion, const PrecomputedTransactionData& cache, MissingDataBehavior mdb)
{
    uint8_t ext_flag, key_version;
    switch (sigversion) {
    case SigVersion::TAPROOT:
        ext_flag = 0;
        // key_version is not used and left uninitialized.
        break;
    case SigVersion::TAPSCRIPT:
        ext_flag = 1;
        // key_version must be 0 for now, representing the current version of
        // 32-byte public keys in the tapscript signature opcode execution.
        // An upgradable public key version (with a size not 32-byte) may
        // request a different key_version with a new sigversion.
        key_version = 0;
        break;
    default:
        assert(false);
    }
    assert(in_pos < tx_to.vin.size());
    if (!(cache.m_bip341_taproot_ready && cache.m_spent_outputs_ready)) {
        return HandleMissingData(mdb);
    }

    HashWriter ss{HASHER_TAPSIGHASH};

    // Epoch
    static constexpr uint8_t EPOCH = 0;
    ss << EPOCH;

    // Hash type
    const uint8_t output_type = (hash_type == SIGHASH_DEFAULT) ? SIGHASH_ALL : (hash_type & SIGHASH_OUTPUT_MASK); // Default (no sighash byte) is equivalent to SIGHASH_ALL
    const uint8_t input_type = hash_type & SIGHASH_INPUT_MASK;
    if (!(hash_type <= 0x03 || (hash_type >= 0x81 && hash_type <= 0x83))) return false;
    ss << hash_type;

    // Transaction level data
    ss << tx_to.version;
    ss << tx_to.nLockTime;
    if (input_type != SIGHASH_ANYONECANPAY) {
        ss << cache.m_prevouts_single_hash;
        ss << cache.m_spent_amounts_single_hash;
        ss << cache.m_spent_scripts_single_hash;
        ss << cache.m_sequences_single_hash;
    }
    if (output_type == SIGHASH_ALL) {
        ss << cache.m_outputs_single_hash;
    }

    // Data about the input/prevout being spent
    assert(execdata.m_annex_init);
    const bool have_annex = execdata.m_annex_present;
    const uint8_t spend_type = (ext_flag << 1) + (have_annex ? 1 : 0); // The low bit indicates whether an annex is present.
    ss << spend_type;
    if (input_type == SIGHASH_ANYONECANPAY) {
        ss << tx_to.vin[in_pos].prevout;
        ss << cache.m_spent_outputs[in_pos];
        ss << tx_to.vin[in_pos].nSequence;
    } else {
        ss << in_pos;
    }
    if (have_annex) {
        ss << execdata.m_annex_hash;
    }

    // Data about the output (if only one).
    if (output_type == SIGHASH_SINGLE) {
        if (in_pos >= tx_to.vout.size()) return false;
        if (!execdata.m_output_hash) {
            HashWriter sha_single_output{};
            sha_single_output << tx_to.vout[in_pos];
            execdata.m_output_hash = sha_single_output.GetSHA256();
        }
        ss << execdata.m_output_hash.value();
    }

    // Additional data for BIP 342 signatures
    if (sigversion == SigVersion::TAPSCRIPT) {
        assert(execdata.m_tapleaf_hash_init);
        ss << execdata.m_tapleaf_hash;
        ss << key_version;
        assert(execdata.m_codeseparator_pos_init);
        ss << execdata.m_codeseparator_pos;
    }

    hash_out = ss.GetSHA256();
    return true;
}